

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_set_channels(exr_context_t ctxt,int part_index,exr_attr_chlist_t *channels)

{
  long lVar1;
  exr_attr_chlist_t *peVar2;
  exr_result_t eVar3;
  code *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *peVar4;
  undefined8 uStackY_40;
  exr_attr_chlist_t clist;
  
  if (channels == (exr_attr_chlist_t *)0x0) {
    eVar3 = (**(code **)(ctxt + 0x40))(ctxt,3,"No channels provided for channel list");
    return eVar3;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_40 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      peVar4 = *(exr_attribute_t **)(lVar1 + 0x20);
      if (peVar4 == (exr_attribute_t *)0x0) {
        eVar3 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"channels",
                                  EXR_ATTR_CHLIST,0,(uint8_t **)0x0,
                                  (exr_attribute_t **)(lVar1 + 0x20));
        if (eVar3 != 0) {
          return eVar3;
        }
        peVar4 = *(exr_attribute_t **)(lVar1 + 0x20);
      }
      else if (peVar4->type != EXR_ATTR_CHLIST) {
        eVar3 = (**(code **)(ctxt + 0x48))
                          (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                           peVar4->type_name,"channels",*(code **)(ctxt + 0x48));
        return eVar3;
      }
      eVar3 = exr_attr_chlist_duplicate(ctxt,&clist,channels);
      if (eVar3 != 0) {
        return eVar3;
      }
      exr_attr_chlist_destroy(ctxt,(peVar4->field_6).chlist);
      peVar2 = (peVar4->field_6).chlist;
      peVar2->num_channels = clist.num_channels;
      peVar2->num_alloced = clist.num_alloced;
      peVar2->entries = clist.entries;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_40 = 8;
  }
  eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_40);
  return eVar3;
}

Assistant:

exr_result_t
exr_set_channels (
    exr_context_t ctxt, int part_index, const exr_attr_chlist_t* channels)
{
    if (!channels)
        return EXR_CTXT (ctxt)->report_error (
            EXR_CTXT (ctxt),
            EXR_ERR_INVALID_ARGUMENT,
            "No channels provided for channel list");

    REQ_ATTR_FIND_CREATE (channels, EXR_ATTR_CHLIST);
    if (rv == EXR_ERR_SUCCESS)
    {
        exr_attr_chlist_t clist;

        rv = exr_attr_chlist_duplicate (ctxt, &clist, channels);
        if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        exr_attr_chlist_destroy (ctxt, attr->chlist);
        *(attr->chlist) = clist;
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}